

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

wchar_t player_apply_damage_reduction(player *p,wchar_t dam)

{
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t dam_local;
  player *p_local;
  
  if ((p->timed[0xc] == 0) || (L'⌧' < dam)) {
    local_1c = dam - (p->state).dam_red;
    if ((L'\0' < local_1c) && ((p->state).perc_dam_red != L'\0')) {
      local_1c = local_1c - (local_1c * (p->state).perc_dam_red) / 100;
    }
    if (local_1c < L'\0') {
      local_20 = L'\0';
    }
    else {
      local_20 = local_1c;
    }
    p_local._4_4_ = local_20;
  }
  else {
    p_local._4_4_ = L'\0';
  }
  return p_local._4_4_;
}

Assistant:

int player_apply_damage_reduction(struct player *p, int dam)
{
	/* Mega-Hack -- Apply "invulnerability" */
	if (p->timed[TMD_INVULN] && (dam < 9000)) return 0;

	dam -= p->state.dam_red;
	if (dam > 0 && p->state.perc_dam_red) {
		dam -= (dam * p->state.perc_dam_red) / 100 ;
	}

	return (dam < 0) ? 0 : dam;
}